

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherLinux.cpp
# Opt level: O2

void __thiscall FW::FileWatcherLinux::update(FileWatcherLinux *this)

{
  __fd_mask *p_Var1;
  mapped_type pWVar2;
  int iVar3;
  ssize_t sVar4;
  mapped_type *ppWVar5;
  long lVar6;
  char buff [4210688];
  
  iVar3 = this->mFD;
  p_Var1 = (this->mDescriptorSet).fds_bits + iVar3 / 0x40;
  *p_Var1 = *p_Var1 | 1L << ((byte)iVar3 & 0x3f);
  iVar3 = select(iVar3 + 1,(fd_set *)&this->mDescriptorSet,(fd_set *)0x0,(fd_set *)0x0,
                 (timeval *)&this->mTimeOut);
  if (-1 < iVar3) {
    iVar3 = this->mFD;
    if (((ulong)(this->mDescriptorSet).fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1)
        != 0) {
      memset(buff,0,0x404000);
      sVar4 = read(iVar3,buff,0x404000);
      for (lVar6 = 0; lVar6 < sVar4; lVar6 = lVar6 + (ulong)*(uint *)(buff + lVar6 + 0xc) + 0x10) {
        ppWVar5 = std::
                  map<unsigned_long,_FW::WatchStruct_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FW::WatchStruct_*>_>_>
                  ::operator[](&this->mWatches,(key_type *)&stack0xffffffffffbfbfa0);
        pWVar2 = *ppWVar5;
        FileSystemUtils::Path::Path((Path *)&stack0xffffffffffbfbfa0,buff + lVar6 + 0x10);
        (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                  (this,pWVar2,(Path *)&stack0xffffffffffbfbfa0,(ulong)*(uint *)(buff + lVar6 + 4));
        FileSystemUtils::Path::~Path((Path *)&stack0xffffffffffbfbfa0);
      }
    }
    return;
  }
  perror("select");
  return;
}

Assistant:

void FileWatcherLinux::update()
	{
		FD_SET(mFD, &mDescriptorSet);

		int ret = select(mFD + 1, &mDescriptorSet, NULL, NULL, &mTimeOut);
		if(ret < 0)
		{
			perror("select");
		}
		else if(FD_ISSET(mFD, &mDescriptorSet))
		{
			ssize_t len, i = 0;
			//char action[81+FILENAME_MAX] = {0};
			char buff[BUFF_SIZE] = {0};

			len = read (mFD, buff, BUFF_SIZE);
		   
			while (i < len)
			{
				struct inotify_event *pevent = (struct inotify_event *)&buff[i];

				WatchStruct* watch = mWatches[pevent->wd];
				handleAction(watch, pevent->name, pevent->mask);
				i += sizeof(struct inotify_event) + pevent->len;
			}
		}
	}